

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  undefined8 *puVar1;
  pointer pvVar2;
  pointer puVar3;
  unsigned_long uVar4;
  HalfedgeMesh *pHVar5;
  _Base_ptr p_Var6;
  pointer pVVar7;
  _Base_ptr p_Var8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  _Self __tmp;
  iterator iVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  EdgeIter EVar16;
  FaceIter FVar17;
  _List_node_base *p_Var18;
  _Base_ptr p_Var19;
  ostream *poVar20;
  HalfedgeMesh *pHVar21;
  long lVar22;
  _List_node_base *p_Var23;
  const_iterator __begin2;
  pointer puVar24;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar25;
  long lVar26;
  HalfedgeMesh *pHVar27;
  mapped_type mVar28;
  const_iterator __end2;
  pointer pvVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  HalfedgeIter hab;
  unsigned_long i;
  pointer p_Stack_120;
  pointer local_118;
  VertexIter v;
  Index a;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_f8;
  _List_node_base *local_f0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  IndexPair ba;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  
  local_f8 = vertexPositions;
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  local_f0 = (_List_node_base *)&this->vertices;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear
            ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)local_f0);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(&this->edges);
  p_Var23 = (_List_node_base *)&this->faces;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)p_Var23);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar2 = (polygons->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar29 = (polygons->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_e8 = polygons;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pvVar25 = local_e8, pvVar29 != pvVar2) {
    puVar24 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __range2 = pvVar29;
    if ((ulong)((long)puVar3 - (long)puVar24) < 0x11) {
      poVar20 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                               );
      std::endl<char,std::char_traits<char>>(poVar20);
      goto LAB_0010ad9f;
    }
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; pvVar10 = __range2, puVar24 != puVar3; puVar24 = puVar24 + 1) {
      i = *puVar24;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&pairToHalfedge,&i);
      iVar11 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
               ::find(&indexToVertex._M_t,&i);
      if ((_Rb_tree_header *)iVar11._M_node == &indexToVertex._M_t._M_impl.super__Rb_tree_header) {
        v = newVertex(this);
        v._M_node[0xc]._M_prev = (_List_node_base *)this;
        pmVar12 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&indexToVertex._M_t,&i);
        pmVar12->_M_node = v._M_node;
        pmVar13 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[](&vertexDegree,&v);
        *pmVar13 = 1;
      }
      else {
        pmVar12 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&indexToVertex._M_t,&i);
        pmVar13 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[](&vertexDegree,pmVar12);
        *pmVar13 = *pmVar13 + 1;
      }
    }
    if (pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ulong)((long)(__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3)) {
      poVar20 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                               );
      std::endl<char,std::char_traits<char>>(poVar20);
      std::operator<<((ostream *)&std::cerr,"(vertex indices:");
      puVar3 = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (puVar24 = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar24 != puVar3;
          puVar24 = puVar24 + 1) {
        poVar20 = std::operator<<((ostream *)&std::cerr," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      }
      poVar20 = std::operator<<((ostream *)&std::cerr,")");
      std::endl<char,std::char_traits<char>>(poVar20);
      goto LAB_0010ad9f;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&pairToHalfedge);
    pvVar29 = pvVar10 + 1;
  }
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)p_Var23,
             ((long)(local_e8->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_e8->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar29 = (pvVar25->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; p_Var18 = local_f0,
      pvVar29 !=
      (pvVar25->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar29 = pvVar29 + 1) {
    p_Var23 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var23->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    local_118 = (pointer)0x0;
    i = 0;
    p_Stack_120 = (pointer)0x0;
    lVar32 = (long)(pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    for (lVar26 = 1; -lVar32 + lVar26 != 1; lVar26 = lVar26 + 1) {
      puVar24 = (pvVar29->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      v._M_node = (_List_node_base *)puVar24[lVar26 + -1];
      lVar22 = 0;
      if (lVar26 != lVar32) {
        lVar22 = lVar26;
      }
      uVar4 = puVar24[lVar22];
      hab._M_node = (_List_node_base *)0x0;
      a = (Index)v._M_node;
      iVar14 = std::
               _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::find(&pairToHalfedge._M_t,(key_type *)&v);
      if ((_Rb_tree_header *)iVar14._M_node != &pairToHalfedge._M_t._M_impl.super__Rb_tree_header) {
        poVar20 = std::operator<<((ostream *)&std::cerr,
                                  "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                                 );
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
        poVar20 = std::operator<<(poVar20,", ");
        poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
        poVar20 = std::operator<<(poVar20,").");
        std::endl<char,std::char_traits<char>>(poVar20);
        poVar20 = std::operator<<((ostream *)&std::cerr,
                                  "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                                 );
        std::endl<char,std::char_traits<char>>(poVar20);
        poVar20 = std::operator<<((ostream *)&std::cerr,
                                  "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                                 );
        std::endl<char,std::char_traits<char>>(poVar20);
        poVar20 = std::operator<<((ostream *)&std::cerr,"not consistently oriented.");
        std::endl<char,std::char_traits<char>>(poVar20);
        goto LAB_0010ad9f;
      }
      hab = newHalfedge(this);
      pmVar15 = std::
                map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                              *)&pairToHalfedge._M_t,(key_type *)&v);
      pmVar15->_M_node = hab._M_node;
      hab._M_node[3]._M_next = p_Var23;
      p_Var23[9]._M_next = hab._M_node;
      pmVar12 = std::
                map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                ::operator[](&indexToVertex,&a);
      p_Var18 = pmVar12->_M_node;
      hab._M_node[2]._M_next = p_Var18;
      p_Var18[0xc]._M_prev = hab._M_node;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&i,&hab);
      ba.second = a;
      ba.first = uVar4;
      iVar14 = std::
               _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::find(&pairToHalfedge._M_t,&ba);
      if ((_Rb_tree_header *)iVar14._M_node == &pairToHalfedge._M_t._M_impl.super__Rb_tree_header) {
        hab._M_node[1]._M_next = (_List_node_base *)this;
      }
      else {
        p_Var19 = iVar14._M_node[1]._M_left;
        hab._M_node[1]._M_next = (_List_node_base *)p_Var19;
        p_Var19->_M_left = (_Base_ptr)hab._M_node;
        EVar16 = newEdge(this);
        hab._M_node[2]._M_prev = EVar16._M_node;
        p_Var19[1]._M_parent = (_Base_ptr)EVar16._M_node;
        EVar16._M_node[5]._M_prev = hab._M_node;
      }
    }
    for (lVar26 = 1; -lVar32 + lVar26 != 1; lVar26 = lVar26 + 1) {
      lVar22 = lVar26;
      if (lVar26 == lVar32) {
        lVar22 = 0;
      }
      *(undefined8 *)(*(long *)((i - 8) + lVar26 * 8) + 0x18) = *(undefined8 *)(i + lVar22 * 8);
    }
    std::
    _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~_Vector_base((_Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     *)&i);
    pvVar25 = local_e8;
  }
LAB_0010a9ec:
  p_Var18 = p_Var18->_M_next;
  if (p_Var18 != local_f0) {
    p_Var23 = p_Var18[0xc]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var23[1]._M_next == this) {
        p_Var18[0xc]._M_prev = p_Var23;
        break;
      }
      p_Var23 = (((HalfedgeMesh *)p_Var23[1]._M_next)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_next;
    } while (p_Var18[0xc]._M_prev != p_Var23);
    goto LAB_0010a9ec;
  }
  pHVar27 = this;
  p_Var23 = local_f0;
  while (pHVar27 = (HalfedgeMesh *)
                   (pHVar27->halfedges).
                   super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                   _M_node.super__List_node_base._M_next, p_Var18 = p_Var23, pHVar27 != this) {
    if ((HalfedgeMesh *)
        (pHVar27->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
        _M_impl._M_node._M_size == this) {
      FVar17 = newBoundary(this);
      i = 0;
      p_Stack_120 = (pointer)0x0;
      local_118 = (pointer)0x0;
      pHVar21 = pHVar27;
LAB_0010aa56:
      v._M_node = (_List_node_base *)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&i,(value_type *)&v);
      (pHVar21->halfedges).super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>.
      _M_impl._M_node._M_size = (size_t)v._M_node;
      v._M_node[1]._M_next = (_List_node_base *)pHVar21;
      v._M_node[3]._M_next = FVar17._M_node;
      v._M_node[2]._M_next =
           (pHVar21->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next[2]._M_next;
      EVar16 = newEdge(this);
      p_Var23 = local_f0;
      EVar16._M_node[5]._M_prev = (_List_node_base *)pHVar21;
      (pHVar21->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node._M_size = (size_t)EVar16._M_node;
      v._M_node[2]._M_prev = EVar16._M_node;
      pHVar5 = pHVar21;
      while (pHVar21 = (HalfedgeMesh *)
                       (pHVar5->vertices).
                       super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                       _M_node.super__List_node_base._M_next, pHVar27 != pHVar21) {
        pHVar5 = (HalfedgeMesh *)
                 (pHVar21->halfedges).
                 super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                 _M_node._M_size;
        if (pHVar5 == this) goto LAB_0010aa56;
      }
      FVar17._M_node[9]._M_next = *(_List_node_base **)i;
      uVar30 = (long)((long)p_Stack_120 - i) >> 3;
      for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
        *(undefined8 *)(*(long *)(i + uVar31 * 8) + 0x18) =
             *(undefined8 *)(i + (((uVar30 - 1) + uVar31) % uVar30) * 8);
      }
      std::
      _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::~_Vector_base((_Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                       *)&i);
    }
  }
  while (p_Var18 = p_Var18->_M_next, p_Var18 != p_Var23) {
    p_Var18[0xc]._M_prev = *(_List_node_base **)((long)(p_Var18[0xc]._M_prev[1]._M_next + 1) + 8);
  }
  i = (unsigned_long)p_Var23;
  do {
    pvVar9 = local_f8;
    i = (unsigned_long)
        (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
         &((_List_node_base *)i)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if ((_List_node_base *)i == p_Var23) {
      if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl
          ._M_node._M_size <=
          (ulong)(((long)(local_f8->
                         super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_f8->
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        lVar26 = 0;
        p_Var19 = indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var19 != &indexToVertex._M_t._M_impl.super__Rb_tree_header) {
          p_Var6 = p_Var19[1]._M_parent;
          pVVar7 = (pvVar9->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(p_Var6 + 1) = *(undefined8 *)((long)&pVVar7->z + lVar26);
          puVar1 = (undefined8 *)((long)&pVVar7->x + lVar26);
          p_Var8 = (_Base_ptr)puVar1[1];
          p_Var6->_M_left = (_Base_ptr)*puVar1;
          p_Var6->_M_right = p_Var8;
          p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
          lVar26 = lVar26 + 0x18;
        }
        std::
        _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
        ::~_Rb_tree(&pairToHalfedge._M_t);
        std::
        _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
        ::~_Rb_tree(&vertexDegree._M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
        ::~_Rb_tree(&indexToVertex._M_t);
        return;
      }
      poVar20 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
                               );
      std::endl<char,std::char_traits<char>>(poVar20);
      poVar20 = std::operator<<((ostream *)&std::cerr,"(number of positions in input: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      poVar20 = std::operator<<(poVar20,")");
      std::endl<char,std::char_traits<char>>(poVar20);
      poVar20 = std::operator<<((ostream *)&std::cerr,"(  number of vertices in mesh: ");
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
      poVar20 = std::operator<<(poVar20,")");
      std::endl<char,std::char_traits<char>>(poVar20);
      goto LAB_0010ad9f;
    }
    pHVar27 = (HalfedgeMesh *)((_List_node_base *)(i + 0xc0))->_M_prev;
    if (pHVar27 == this) {
      poVar20 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                               );
      std::endl<char,std::char_traits<char>>(poVar20);
      goto LAB_0010ad9f;
    }
    mVar28 = 0;
    pHVar21 = pHVar27;
    do {
      mVar28 = mVar28 + ((ulong)*(byte *)&(pHVar21->edges).
                                          super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>
                                          ._M_impl._M_node.super__List_node_base._M_next[9]._M_prev
                        ^ 1);
      pHVar21 = *(HalfedgeMesh **)
                 ((pHVar21->halfedges).
                  super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                  _M_node._M_size + 0x18);
    } while (pHVar21 != pHVar27);
    pmVar13 = std::
              map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
              ::operator[](&vertexDegree,(key_type *)&i);
  } while (mVar28 == *pmVar13);
  poVar20 = std::operator<<((ostream *)&std::cerr,
                            "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                           );
  std::endl<char,std::char_traits<char>>(poVar20);
LAB_0010ad9f:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (const auto & polygon : polygons) {
    if (polygon.size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // construct something fairly meaningful for 1- and 2-point polygons, but
      // enforcing this stricter requirement on the input will help simplify code
      // further downstream, since it can be certain it doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (unsigned long i : polygon) {
      polygonIndices.insert(i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(i) == indexToVertex.end()) {
        auto v = newVertex();
        v->halfedge() = halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = polygon.size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (unsigned long i : polygon) {
        cerr << " " << i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      auto iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        auto hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        auto e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j = (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    auto h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (auto h = halfedgesBegin(); h != halfedgesEnd(); h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      auto b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      auto i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        auto t = newHalfedge();
        boundaryHalfedges.push_back(t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        auto e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (auto v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    auto h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    i++;
  }

}